

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

float __thiscall pbrt::SampledGrid<float>::Lookup(SampledGrid<float> *this,Point3i *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  
  uVar1 = this->nx;
  uVar2 = this->nz;
  iVar3 = (p->super_Tuple3<pbrt::Point3,_int>).x;
  fVar9 = 0.0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = uVar1;
  }
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  if (((int)((int)uVar1 >> 0x1f & uVar1) <= iVar3) && (iVar3 < (int)uVar7)) {
    uVar7 = this->ny;
    iVar4 = (p->super_Tuple3<pbrt::Point3,_int>).y;
    uVar8 = 0;
    if ((int)uVar7 < 0) {
      uVar8 = uVar7;
    }
    if (((((int)uVar8 <= iVar4) && (iVar4 < (int)(~((int)uVar7 >> 0x1f) & uVar7))) &&
        (iVar5 = (p->super_Tuple3<pbrt::Point3,_int>).z, (int)((int)uVar2 >> 0x1f & uVar2) <= iVar5)
        ) && (iVar5 < (int)uVar6)) {
      fVar9 = (this->values).ptr[(int)((iVar5 * uVar7 + iVar4) * uVar1 + iVar3)];
    }
  }
  return fVar9;
}

Assistant:

PBRT_CPU_GPU
    T Lookup(const Point3i &p) const {
        Bounds3i sampleBounds(Point3i(0, 0, 0), Point3i(nx, ny, nz));
        if (!InsideExclusive(p, sampleBounds))
            return {};
        return values[(p.z * ny + p.y) * nx + p.x];
    }